

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O2

pcp_flow_info_t * pcp_flow_get_info(pcp_flow_t *f,size_t *info_count)

{
  byte bVar1;
  undefined8 uVar2;
  pcp_flow_info_t *__nmemb;
  pcp_flow_info_t *ppVar3;
  pcp_flow_s *ppVar4;
  uint8_t *puVar5;
  pcp_fstate_e pVar6;
  uint uVar7;
  
  ppVar3 = (pcp_flow_info_t *)0x0;
  __nmemb = ppVar3;
  ppVar4 = f;
  if (info_count != (size_t *)0x0) {
    for (; ppVar4 != (pcp_flow_t *)0x0; ppVar4 = ppVar4->next_child) {
      __nmemb = (pcp_flow_info_t *)(ulong)((int)__nmemb + 1);
    }
    ppVar3 = (pcp_flow_info_t *)calloc((size_t)__nmemb,0x68);
    if (ppVar3 == (pcp_flow_info_t *)0x0) {
      ppVar3 = (pcp_flow_info_t *)0x0;
    }
    else {
      puVar5 = &ppVar3->learned_dscp;
      for (; f != (pcp_flow_t *)0x0; f = f->next_child) {
        uVar7 = f->state + ~pfs_wait_resp;
        pVar6 = pcp_state_processing;
        if (uVar7 < 4) {
          pVar6 = *(pcp_fstate_e *)(&DAT_001083f0 + (ulong)uVar7 * 4);
        }
        ((pcp_flow_info_t *)(puVar5 + -0x67))->result = pVar6;
        *(time_t *)(puVar5 + -0x3f) = f->recv_lifetime;
        *(ulong *)(puVar5 + -0x37) = (ulong)f->lifetime;
        puVar5[-0x2f] = (uint8_t)f->recv_result;
        uVar2 = *(undefined8 *)((long)&(f->kd).src_ip.__in6_u + 8);
        *(undefined8 *)&((in6_addr *)(puVar5 + -0x2b))->__in6_u =
             *(undefined8 *)&(f->kd).src_ip.__in6_u;
        *(undefined8 *)(puVar5 + -0x23) = uVar2;
        uVar2 = *(undefined8 *)((long)&(f->kd).pcp_server_ip.__in6_u + 8);
        *(undefined8 *)&((in6_addr *)(puVar5 + -99))->__in6_u =
             *(undefined8 *)&(f->kd).pcp_server_ip.__in6_u;
        *(undefined8 *)(puVar5 + -0x5b) = uVar2;
        *(uint32_t *)(puVar5 + -0x17) = (f->kd).scope_id;
        bVar1 = (f->kd).operation;
        if (bVar1 - 1 < 2) {
          uVar2 = *(undefined8 *)((long)&(f->kd).field_5 + 0xc);
          *(undefined8 *)&((in6_addr *)(puVar5 + -0x13))->__in6_u =
               *(undefined8 *)((long)&(f->kd).field_5 + 4);
          *(undefined8 *)(puVar5 + -0xb) = uVar2;
          uVar2 = *(undefined8 *)((long)&f->field_5 + 8);
          *(undefined8 *)&((in6_addr *)(puVar5 + -0x53))->__in6_u = *(undefined8 *)&f->field_5;
          *(undefined8 *)(puVar5 + -0x4b) = uVar2;
          *(uint16_t *)(puVar5 + -0x1b) = (f->kd).field_5.map_peer.src_port;
          *(uint16_t *)(puVar5 + -3) = (f->kd).field_5.map_peer.dst_port;
          *(uint16_t *)(puVar5 + -0x43) = (f->field_5).map_peer.ext_port;
          puVar5[-1] = (f->kd).field_5.map_peer.protocol;
        }
        else if (bVar1 == 3) {
          *puVar5 = (f->field_5).sadscp.learned_dscp;
        }
        puVar5 = puVar5 + 0x68;
      }
      *info_count = (size_t)__nmemb;
    }
  }
  return ppVar3;
}

Assistant:

pcp_flow_info_t *pcp_flow_get_info(pcp_flow_t *f, size_t *info_count) {
    pcp_flow_t *fiter;
    pcp_flow_info_t *info_buf;
    pcp_flow_info_t *info_iter;
    uint32_t cnt = 0;

    if (!info_count) {
        return NULL;
    }

    for (fiter = f; fiter; fiter = fiter->next_child) {
        ++cnt;
    }

    info_buf = (pcp_flow_info_t *)calloc(cnt, sizeof(pcp_flow_info_t));
    if (!info_buf) {
        PCP_LOG(PCP_LOGLVL_DEBUG, "%s", "Error allocating memory");
        return NULL;
    }

    for (fiter = f, info_iter = info_buf; fiter != NULL;
         fiter = fiter->next_child, ++info_iter) {

        switch (fiter->state) {
        case pfs_wait_after_short_life_error:
            info_iter->result = pcp_state_short_lifetime_error;
            break;
        case pfs_wait_for_lifetime_renew:
            info_iter->result = pcp_state_succeeded;
            break;
        case pfs_failed:
            info_iter->result = pcp_state_failed;
            break;
        default:
            info_iter->result = pcp_state_processing;
            break;
        }

        info_iter->recv_lifetime_end = fiter->recv_lifetime;
        info_iter->lifetime_renew_s = fiter->lifetime;
        info_iter->pcp_result_code = fiter->recv_result;
        memcpy(&info_iter->int_ip, &fiter->kd.src_ip, sizeof(struct in6_addr));
        memcpy(&info_iter->pcp_server_ip, &fiter->kd.pcp_server_ip,
               sizeof(info_iter->pcp_server_ip));
        info_iter->int_scope_id = fiter->kd.scope_id;
        if ((fiter->kd.operation == PCP_OPCODE_MAP) ||
            (fiter->kd.operation == PCP_OPCODE_PEER)) {
            memcpy(&info_iter->dst_ip, &fiter->kd.map_peer.dst_ip,
                   sizeof(info_iter->dst_ip));
            memcpy(&info_iter->ext_ip, &fiter->map_peer.ext_ip,
                   sizeof(info_iter->ext_ip));
            info_iter->int_port = fiter->kd.map_peer.src_port;
            info_iter->dst_port = fiter->kd.map_peer.dst_port;
            info_iter->ext_port = fiter->map_peer.ext_port;
            info_iter->protocol = fiter->kd.map_peer.protocol;
#ifdef PCP_SADSCP
        } else if (fiter->kd.operation == PCP_OPCODE_SADSCP) {
            info_iter->learned_dscp = fiter->sadscp.learned_dscp;
#endif
        }
    }
    *info_count = cnt;

    return info_buf;
}